

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O1

void __thiscall
duckdb::SortedAggregateState::FlushLinkedLists
          (SortedAggregateState *this,SortedAggregateBindData *order_bind)

{
  type pDVar1;
  const_reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  size_type sVar5;
  
  InitializeChunks(this,order_bind);
  pDVar1 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
                     (&this->sort_chunk);
  if ((this->sort_linked).super_vector<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>.
      super__Vector_base<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->sort_linked).super_vector<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>.
      super__Vector_base<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar5 = 0;
    do {
      pvVar2 = vector<duckdb::ListSegmentFunctions,_true>::operator[](&order_bind->sort_funcs,sVar5)
      ;
      pvVar3 = vector<duckdb::LinkedList,_true>::operator[](&this->sort_linked,sVar5);
      pvVar4 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,sVar5);
      ListSegmentFunctions::BuildListVector(pvVar2,pvVar3,pvVar4,0);
      pvVar3 = vector<duckdb::LinkedList,_true>::operator[](&this->sort_linked,sVar5);
      pDVar1->count = pvVar3->total_capacity;
      sVar5 = sVar5 + 1;
    } while (sVar5 < (ulong)(((long)(this->sort_linked).
                                    super_vector<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>
                                    .
                                    super__Vector_base<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->sort_linked).
                                    super_vector<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>
                                    .
                                    super__Vector_base<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  if ((this->arg_chunk).super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
      ._M_t.super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
      super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl != (DataChunk *)0x0) {
    pDVar1 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
                       (&this->arg_chunk);
    if ((this->arg_linked).super_vector<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>.
        super__Vector_base<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->arg_linked).super_vector<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>.
        super__Vector_base<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>._M_impl.
        super__Vector_impl_data._M_start) {
      sVar5 = 0;
      do {
        pvVar2 = vector<duckdb::ListSegmentFunctions,_true>::operator[]
                           (&order_bind->arg_funcs,sVar5);
        pvVar3 = vector<duckdb::LinkedList,_true>::operator[](&this->arg_linked,sVar5);
        pvVar4 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,sVar5);
        ListSegmentFunctions::BuildListVector(pvVar2,pvVar3,pvVar4,0);
        pvVar3 = vector<duckdb::LinkedList,_true>::operator[](&this->arg_linked,sVar5);
        pDVar1->count = pvVar3->total_capacity;
        sVar5 = sVar5 + 1;
      } while (sVar5 < (ulong)(((long)(this->arg_linked).
                                      super_vector<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>
                                      .
                                      super__Vector_base<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->arg_linked).
                                      super_vector<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>
                                      .
                                      super__Vector_base<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x5555555555555555));
    }
  }
  return;
}

Assistant:

void FlushLinkedLists(const SortedAggregateBindData &order_bind) {
		InitializeChunks(order_bind);
		FlushLinkedList(order_bind.sort_funcs, sort_linked, *sort_chunk);
		if (arg_chunk) {
			FlushLinkedList(order_bind.arg_funcs, arg_linked, *arg_chunk);
		}
	}